

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O3

double cholmod(double *A,int N,double *L,double eps,double maxinp)

{
  long lVar1;
  double *array;
  int iVar2;
  ulong uVar3;
  double *pdVar4;
  ulong uVar5;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  ulong uVar9;
  double *pdVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  lVar8 = (long)N;
  array = (double *)malloc(lVar8 * lVar8 * 8);
  if (eps < 0.0) {
    dVar14 = sqrt(eps);
  }
  else {
    dVar14 = SQRT(eps);
  }
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  uVar12 = (ulong)(uint)N;
  if (0 < N) {
    iVar2 = 0;
    uVar5 = 0;
    do {
      array[uVar5] = A[iVar2];
      uVar5 = uVar5 + 1;
      iVar2 = iVar2 + N + 1;
    } while (uVar12 != uVar5);
  }
  if (N != 0) {
    memset(L,0,(ulong)(N * N + (uint)(N * N == 0)) << 3);
  }
  dVar15 = array_max_abs(array,N);
  dVar20 = maxinp;
  if ((maxinp == 0.0) && (!NAN(maxinp))) {
    if (dVar15 < 0.0) {
      dVar20 = sqrt(dVar15);
    }
    else {
      dVar20 = SQRT(dVar15);
    }
  }
  if (eps < 0.0) {
    dVar15 = sqrt(eps);
  }
  else {
    dVar15 = SQRT(eps);
  }
  if (N < 1) {
    dVar18 = 0.0;
  }
  else {
    pdVar6 = L + uVar12;
    uVar13 = 1;
    pdVar7 = L;
    pdVar10 = pdVar6;
    uVar5 = 0;
    dVar21 = 0.0;
    do {
      dVar16 = 0.0;
      if (uVar5 != 0) {
        uVar3 = 0;
        do {
          dVar16 = dVar16 + pdVar7[uVar3] * pdVar7[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
      }
      lVar1 = uVar5 * uVar12 + uVar5;
      dVar16 = A[lVar1] - dVar16;
      L[lVar1] = dVar16;
      uVar3 = uVar5 + 1;
      dVar18 = 0.0;
      if ((long)uVar3 < lVar8) {
        dVar18 = 0.0;
        pdVar4 = pdVar10;
        uVar9 = uVar13;
        do {
          dVar16 = 0.0;
          if (uVar5 != 0) {
            uVar11 = 0;
            do {
              dVar16 = dVar16 + pdVar7[uVar11] * pdVar4[uVar11];
              uVar11 = uVar11 + 1;
            } while (uVar5 != uVar11);
          }
          dVar19 = A[uVar5 * uVar12 + uVar9];
          L[uVar5 + uVar9 * uVar12] = dVar19 - dVar16;
          dVar16 = ABS(dVar19 - dVar16);
          if (dVar16 <= dVar18) {
            dVar16 = dVar18;
          }
          dVar18 = dVar16;
          uVar9 = uVar9 + 1;
          pdVar4 = pdVar4 + uVar12;
        } while (uVar9 != uVar12);
        dVar16 = L[lVar1];
      }
      dVar19 = dVar18 / dVar20;
      if (dVar18 / dVar20 <= dVar14 * maxinp) {
        dVar19 = dVar14 * maxinp;
      }
      dVar18 = dVar21;
      if (dVar16 <= dVar19 * dVar19) {
        dVar17 = dVar15 * dVar20;
        if (dVar15 * dVar20 <= dVar19) {
          dVar17 = dVar19;
        }
        dVar18 = dVar17 * dVar17 - dVar16;
        if (dVar18 <= dVar21) {
          dVar18 = dVar21;
        }
      }
      else if (dVar16 < 0.0) {
        dVar17 = sqrt(dVar16);
      }
      else {
        dVar17 = SQRT(dVar16);
      }
      L[lVar1] = dVar17;
      uVar5 = uVar12;
      pdVar4 = pdVar6;
      if ((long)uVar3 < lVar8) {
        do {
          *pdVar4 = *pdVar4 / L[lVar1];
          uVar5 = uVar5 - 1;
          pdVar4 = pdVar4 + uVar12;
        } while (uVar13 != uVar5);
      }
      uVar13 = uVar13 + 1;
      pdVar7 = pdVar7 + uVar12;
      pdVar10 = pdVar10 + uVar12;
      pdVar6 = pdVar6 + uVar12 + 1;
      uVar5 = uVar3;
      dVar21 = dVar18;
    } while (uVar3 != uVar12);
  }
  free(array);
  return dVar18;
}

Assistant:

double cholmod(double *A, int N, double *L, double eps,double maxinp) {
	/*
	 * Algorithm 5.5.2 Dennis, Schnabel, Numerical Methods for Unconstrained Optimization and 
	 * Non-Linear Equations
	 */ 
	int i,j,k,step,step2;
	double ls;
	double *U22;
	double maxadd,maxdiag,minl,minl2,minljj;
	
	U22 = (double*) malloc(sizeof(double) * N * N);
	
	minl = sqrt(sqrt(eps)) * maxinp;
	maxadd = 0.0;
	
	for(i = 0; i < N;++i) {
		U22[i] = A[i+i*N];
	}
	
	for(i = 0; i < N * N;++i) {
		L[i] = 0.0;
	}
	
	maxdiag = array_max_abs(U22,N);
	
	if ( maxinp == 0.0) {
		maxinp = sqrt(maxdiag);
	}
	
	minl2 = sqrt(eps) * maxinp;
	
	for(j = 0; j < N;++j) {
		step = j * N;
		ls = 0.0;
		for(i = 0; i < j;++i) {
			ls += L[step+i] * L[step+i];
		}
		
		L[step+j] = A[step+j] - ls;
		minljj = 0.0;
		for(i = j+1; i < N;++i) {
			ls = 0.0;
			step2 = i * N;
			for(k = 0;k < j;++k) {
				ls += L[step+k] * L[step2+k];
			}
			L[step2+j] = A[step+i] - ls;
			
			if (fabs(L[step2+j]) > minljj) {
				minljj = fabs(L[step2+j]);
			}
		}
		
		if (minljj/maxinp > minl) {
			minljj = minljj/maxinp;
		} else {
			minljj = minl;
		}
		
		if (L[step+j] > minljj*minljj) {
				L[step+j] = sqrt(L[step+j]);
		} else {
			if (minljj < minl2) {
				minljj = minl2;
			}
			
			if (maxadd < (minljj*minljj - L[step+j])) {
				maxadd = minljj*minljj - L[step+j];
			}
			
			L[step+j] = minljj;
		}
		
		for(i = j+1; i < N;++i) {
			L[i*N+j] /= L[step+j];
		}
		
		
	}
	
	free(U22);
	
	return maxadd;
}